

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  Rep *pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Type *pTVar5;
  size_t sVar6;
  uint uVar7;
  int n;
  void **ppvVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  
  uVar4 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  uVar10 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->file_to_generate_).super_RepeatedPtrFieldBase,uVar7);
      uVar3 = (uint)pTVar5->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar10 = uVar10 + pTVar5->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  lVar12 = (long)(this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  sVar11 = uVar10 + lVar12;
  pRVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar9 = 0;
    do {
      sVar6 = FileDescriptorProto::ByteSizeLong(*(FileDescriptorProto **)((long)ppvVar8 + lVar9));
      uVar4 = (uint)sVar6 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar9 = lVar9 + 8;
    } while (lVar12 * 8 != lVar9);
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 1) != 0) {
      lVar12 = *(long *)(((ulong)(this->parameter_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar7 = (uint)lVar12 | 1;
      iVar2 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + lVar12 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar6 = Version::ByteSizeLong(this->compiler_version_);
      uVar4 = (uint)sVar6 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar11 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar11,&this->_cached_size_);
  return sVar11;
}

Assistant:

size_t CodeGeneratorRequest::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(file_to_generate_.size());
  for (int i = 0, n = file_to_generate_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      file_to_generate_.Get(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  total_size += 1UL * this->_internal_proto_file_size();
  for (const auto& msg : this->proto_file_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string parameter = 2;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_parameter());
    }

    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *compiler_version_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}